

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_image_utils.cpp
# Opt level: O3

bool crnlib::image_utils::resample_single_thread
               (image_u8 *src,image_u8 *dst,resample_params *params)

{
  uint src_y;
  uint uVar1;
  Contrib_List *Pclist_x;
  Contrib_List *Pclist_y;
  int iVar2;
  byte bVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  Resampler *pRVar8;
  Resampler *this;
  Sample *pSVar9;
  uint uVar10;
  color_quad<unsigned_char,_int> *pcVar11;
  elemental_vector *peVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  int i_1;
  int i;
  long lVar16;
  uint uVar17;
  ulong uVar18;
  bool bVar19;
  float fVar20;
  float fVar21;
  vector<float> samples [4];
  Resampler *resamplers [4];
  float srgb_to_linear [256];
  uchar linear_to_srgb [8192];
  image_u8 *local_24a8;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_249c;
  elemental_vector local_2498;
  elemental_vector local_2488;
  undefined8 local_2478;
  undefined8 uStack_2470;
  undefined8 local_2468;
  undefined8 uStack_2460;
  Resampler *local_2458 [4];
  float afStack_2438 [256];
  byte abStack_2038 [8200];
  
  uVar7 = src->m_width;
  src_y = src->m_height;
  uVar5 = src_y;
  if (src_y < uVar7) {
    uVar5 = uVar7;
  }
  if (0x4000 < uVar5) {
LAB_00119e80:
    puts("Image is too large!");
    return true;
  }
  if (params->m_num_comps - 5 < 0xfffffffc) {
    return false;
  }
  uVar5 = params->m_dst_width;
  uVar10 = params->m_dst_height;
  uVar17 = uVar10;
  if (uVar5 < uVar10) {
    uVar17 = uVar5;
  }
  uVar14 = uVar10;
  if (uVar10 < uVar5) {
    uVar14 = uVar5;
  }
  if ((uVar17 == 0) || (0x4000 < uVar14)) goto LAB_00119e80;
  if (src_y == uVar10 && uVar7 == uVar5) {
    image<crnlib::color_quad<unsigned_char,_int>_>::operator=(dst,src);
    return true;
  }
  dst->m_pPixels = (color_quad<unsigned_char,_int> *)0x0;
  pcVar11 = (dst->m_pixel_buf).m_p;
  if (pcVar11 != (color_quad<unsigned_char,_int> *)0x0) {
    crnlib_free(pcVar11);
    (dst->m_pixel_buf).m_p = (color_quad<unsigned_char,_int> *)0x0;
    (dst->m_pixel_buf).m_size = 0;
    (dst->m_pixel_buf).m_capacity = 0;
  }
  dst->m_width = 0;
  dst->m_height = 0;
  dst->m_pitch = 0;
  dst->m_total = 0;
  dst->m_comp_flags = 0xf;
  local_249c.m_u32 = 0xff000000;
  image<crnlib::color_quad<unsigned_char,_int>_>::resize
            (dst,params->m_dst_width,params->m_dst_height,0xffffffff,
             (color_quad<unsigned_char,_int> *)&local_249c.field_0);
  fVar21 = params->m_source_gamma;
  bVar3 = params->m_srgb;
  if ((bool)bVar3 == true) {
    lVar16 = 0;
    do {
      fVar20 = powf((float)(int)lVar16 / 255.0,fVar21);
      afStack_2438[lVar16] = fVar20;
      lVar16 = lVar16 + 1;
    } while (lVar16 != 0x100);
    bVar3 = params->m_srgb;
  }
  local_24a8 = dst;
  if ((bVar3 & 1) != 0) {
    lVar16 = 0;
    do {
      fVar20 = powf((float)(int)lVar16 * 0.00012207031,1.0 / fVar21);
      iVar6 = (int)(fVar20 * 255.0 + 0.5);
      if (0xfe < iVar6) {
        iVar6 = 0xff;
      }
      bVar3 = (byte)iVar6;
      if (iVar6 < 1) {
        bVar3 = 0;
      }
      abStack_2038[lVar16] = bVar3;
      lVar16 = lVar16 + 1;
    } while (lVar16 != 0x2000);
  }
  local_2468 = 0;
  uStack_2460 = 0;
  local_2478 = 0;
  uStack_2470 = 0;
  local_2488.m_p = (void *)0x0;
  local_2488.m_size = 0;
  local_2488.m_capacity = 0;
  local_2498.m_p = (void *)0x0;
  local_2498.m_size = 0;
  local_2498.m_capacity = 0;
  bVar19 = params->m_wrapping;
  pRVar8 = (Resampler *)crnlib_malloc(0x78);
  Resampler::Resampler
            (pRVar8,uVar7,src_y,uVar5,uVar10,(bVar19 ^ 1) * 2,0.0,1.0,params->m_pFilter,
             (Contrib_List *)0x0,(Contrib_List *)0x0,params->m_filter_scale,params->m_filter_scale,
             0.0,0.0);
  local_2458[0] = pRVar8;
  if (local_2498.m_size != uVar7) {
    if (local_2498.m_size <= uVar7) {
      if (local_2498.m_capacity < uVar7) {
        elemental_vector::increase_capacity
                  (&local_2498,uVar7,local_2498.m_size + 1 == uVar7,4,(object_mover)0x0,false);
      }
      memset((void *)((ulong)local_2498.m_size * 4 + (long)local_2498.m_p),0,
             (ulong)(uVar7 - local_2498.m_size) << 2);
    }
    local_2498.m_size = uVar7;
  }
  uVar13 = (ulong)params->m_num_comps;
  if (1 < params->m_num_comps) {
    uVar18 = 1;
    peVar12 = &local_2488;
    do {
      bVar19 = params->m_wrapping;
      Pclist_x = pRVar8->m_Pclist_x;
      Pclist_y = pRVar8->m_Pclist_y;
      this = (Resampler *)crnlib_malloc(0x78);
      Resampler::Resampler
                (this,uVar7,src_y,uVar5,uVar10,(uint)(bVar19 ^ 1) * 2,0.0,1.0,params->m_pFilter,
                 Pclist_x,Pclist_y,params->m_filter_scale,params->m_filter_scale,0.0,0.0);
      local_2458[uVar18] = this;
      uVar17 = peVar12->m_size;
      if (uVar17 != uVar7) {
        if (uVar17 <= uVar7) {
          if (peVar12->m_capacity < uVar7) {
            elemental_vector::increase_capacity
                      (peVar12,uVar7,uVar17 + 1 == uVar7,4,(object_mover)0x0,false);
            uVar17 = peVar12->m_size;
          }
          memset((void *)((ulong)uVar17 * 4 + (long)peVar12->m_p),0,(ulong)(uVar7 - uVar17) << 2);
        }
        peVar12->m_size = uVar7;
      }
      uVar18 = uVar18 + 1;
      uVar13 = (ulong)params->m_num_comps;
      peVar12 = peVar12 + 1;
    } while (uVar18 < uVar13);
  }
  if (src_y == 0) {
    if ((int)uVar13 == 0) goto LAB_0011a46b;
  }
  else {
    bVar19 = false;
    uVar10 = 0;
    iVar6 = 0;
    do {
      if (uVar7 != 0) {
        pcVar11 = src->m_pPixels + src->m_pitch * uVar10;
        uVar1 = params->m_first_comp;
        bVar4 = params->m_srgb;
        uVar18 = 0;
        do {
          if ((int)uVar13 != 0) {
            lVar16 = 0;
            uVar15 = uVar1;
            do {
              if ((uVar15 == 3) || ((bVar4 & 1U) == 0)) {
                fVar21 = (float)(pcVar11->field_0).c[uVar15] * 0.003921569;
              }
              else {
                fVar21 = afStack_2438[(pcVar11->field_0).c[uVar15]];
              }
              *(float *)(*(long *)((long)&local_2498.m_p + lVar16) + uVar18 * 4) = fVar21;
              lVar16 = lVar16 + 0x10;
              uVar15 = uVar15 + 1;
            } while (uVar13 << 4 != lVar16);
          }
          pcVar11 = pcVar11 + 1;
          uVar18 = uVar18 + 1;
        } while (uVar18 != uVar7);
      }
      iVar2 = iVar6;
      if ((int)uVar13 == 0) {
        uVar13 = 0;
      }
      else {
        peVar12 = &local_2498;
        uVar18 = 0;
        do {
          bVar4 = Resampler::put_line(local_2458[uVar18],(Sample *)peVar12->m_p);
          if (!bVar4) {
            uVar7 = params->m_num_comps;
            if (uVar7 != 0) {
              uVar13 = 0;
              do {
                pRVar8 = local_2458[uVar13];
                if (pRVar8 != (Resampler *)0x0) {
                  Resampler::~Resampler(pRVar8);
                  crnlib_free(pRVar8);
                  uVar7 = params->m_num_comps;
                }
                uVar13 = uVar13 + 1;
              } while (uVar13 < uVar7);
            }
            goto LAB_0011a46e;
          }
          uVar18 = uVar18 + 1;
          uVar13 = (ulong)params->m_num_comps;
          peVar12 = peVar12 + 1;
        } while (uVar18 < uVar13);
      }
      do {
        iVar6 = iVar2;
        if ((int)uVar13 == 0) {
          uVar13 = 0;
          uVar17 = 0;
        }
        else {
          uVar18 = 0;
          do {
            uVar1 = params->m_first_comp;
            pSVar9 = Resampler::get_line(local_2458[uVar18]);
            if (pSVar9 == (Sample *)0x0) {
              uVar13 = (ulong)params->m_num_comps;
              break;
            }
            uVar17 = uVar1 + (int)uVar18;
            bVar19 = params->m_srgb;
            uVar1 = local_24a8->m_pitch;
            pcVar11 = local_24a8->m_pPixels;
            uVar13 = 0;
            do {
              if ((uVar17 != 3 & bVar19) == 0) {
                uVar14 = (uint)(pSVar9[uVar13] * 255.0 + 0.5);
                if (0xfe < (int)uVar14) {
                  uVar14 = 0xff;
                }
                if ((int)uVar14 < 1) {
                  uVar14 = 0;
                }
              }
              else {
                uVar14 = (uint)(pSVar9[uVar13] * 8192.0 + 0.5);
                if (0x1ffe < (int)uVar14) {
                  uVar14 = 0x1fff;
                }
                if ((int)uVar14 < 1) {
                  uVar14 = 0;
                }
                uVar14 = (uint)abStack_2038[uVar14];
              }
              pcVar11[uVar1 * iVar6 + uVar13].field_0.c[uVar17] = (uchar)uVar14;
              uVar13 = uVar13 + 1;
            } while (uVar5 != uVar13);
            uVar18 = uVar18 + 1;
            uVar13 = (ulong)params->m_num_comps;
          } while (uVar18 < uVar13);
          uVar17 = (uint)uVar18;
        }
        iVar2 = iVar6 + 1;
      } while ((uint)uVar13 <= uVar17);
      uVar10 = uVar10 + 1;
      bVar19 = src_y <= uVar10;
    } while (uVar10 != src_y);
  }
  uVar18 = 0;
  do {
    pRVar8 = local_2458[uVar18];
    if (pRVar8 != (Resampler *)0x0) {
      Resampler::~Resampler(pRVar8);
      crnlib_free(pRVar8);
      uVar13 = (ulong)params->m_num_comps;
    }
    uVar18 = uVar18 + 1;
  } while (uVar18 < uVar13);
LAB_0011a46b:
  bVar19 = true;
LAB_0011a46e:
  lVar16 = 0x40;
  do {
    if (*(void **)((long)&local_24a8 + lVar16) != (void *)0x0) {
      crnlib_free(*(void **)((long)&local_24a8 + lVar16));
    }
    lVar16 = lVar16 + -0x10;
  } while (lVar16 != 0);
  return bVar19;
}

Assistant:

bool resample_single_thread(const image_u8& src, image_u8& dst, const resample_params& params)
        {
            const uint src_width = src.get_width();
            const uint src_height = src.get_height();

            if (math::maximum(src_width, src_height) > CRNLIB_RESAMPLER_MAX_DIMENSION)
            {
                printf("Image is too large!\n");
                return EXIT_FAILURE;
            }

            const int cMaxComponents = 4;
            if (((int)params.m_num_comps < 1) || ((int)params.m_num_comps > (int)cMaxComponents))
            {
                return false;
            }

            const uint dst_width = params.m_dst_width;
            const uint dst_height = params.m_dst_height;

            if ((math::minimum(dst_width, dst_height) < 1) || (math::maximum(dst_width, dst_height) > CRNLIB_RESAMPLER_MAX_DIMENSION))
            {
                printf("Image is too large!\n");
                return EXIT_FAILURE;
            }

            if ((src_width == dst_width) && (src_height == dst_height))
            {
                dst = src;
                return true;
            }

            dst.clear();
            dst.resize(params.m_dst_width, params.m_dst_height);

            // Partial gamma correction looks better on mips. Set to 1.0 to disable gamma correction.
            const float source_gamma = params.m_source_gamma; //1.75f;

            float srgb_to_linear[256];
            if (params.m_srgb)
            {
                for (int i = 0; i < 256; ++i)
                {
                    srgb_to_linear[i] = (float)pow(i * 1.0f / 255.0f, source_gamma);
                }
            }

            const int linear_to_srgb_table_size = 8192;
            unsigned char linear_to_srgb[linear_to_srgb_table_size];

            const float inv_linear_to_srgb_table_size = 1.0f / linear_to_srgb_table_size;
            const float inv_source_gamma = 1.0f / source_gamma;

            if (params.m_srgb)
            {
                for (int i = 0; i < linear_to_srgb_table_size; ++i)
                {
                    int k = (int)(255.0f * pow(i * inv_linear_to_srgb_table_size, inv_source_gamma) + .5f);
                    if (k < 0)
                    {
                        k = 0;
                    }
                    else if (k > 255)
                    {
                        k = 255;
                    }
                    linear_to_srgb[i] = (unsigned char)k;
                }
            }

            Resampler* resamplers[cMaxComponents];
            crnlib::vector<float> samples[cMaxComponents];

            resamplers[0] = crnlib_new<Resampler>(src_width, src_height, dst_width, dst_height,
                params.m_wrapping ? Resampler::BOUNDARY_WRAP : Resampler::BOUNDARY_CLAMP, 0.0f, 1.0f,
                params.m_pFilter, (Resampler::Contrib_List*)nullptr, (Resampler::Contrib_List*)nullptr, params.m_filter_scale, params.m_filter_scale);
            samples[0].resize(src_width);

            for (uint i = 1; i < params.m_num_comps; i++)
            {
                resamplers[i] = crnlib_new<Resampler>(src_width, src_height, dst_width, dst_height,
                    params.m_wrapping ? Resampler::BOUNDARY_WRAP : Resampler::BOUNDARY_CLAMP, 0.0f, 1.0f,
                    params.m_pFilter, resamplers[0]->get_clist_x(), resamplers[0]->get_clist_y(), params.m_filter_scale, params.m_filter_scale);
                samples[i].resize(src_width);
            }

            uint dst_y = 0;

            for (uint src_y = 0; src_y < src_height; src_y++)
            {
                const color_quad_u8* pSrc = src.get_scanline(src_y);

                for (uint x = 0; x < src_width; x++)
                {
                    for (uint c = 0; c < params.m_num_comps; c++)
                    {
                        const uint comp_index = params.m_first_comp + c;
                        const uint8 v = (*pSrc)[comp_index];

                        if (!params.m_srgb || (comp_index == 3))
                        {
                            samples[c][x] = v * (1.0f / 255.0f);
                        }
                        else
                        {
                            samples[c][x] = srgb_to_linear[v];
                        }
                    }

                    pSrc++;
                }

                for (uint c = 0; c < params.m_num_comps; c++)
                {
                    if (!resamplers[c]->put_line(&samples[c][0]))
                    {
                        for (uint i = 0; i < params.m_num_comps; i++)
                        {
                            crnlib_delete(resamplers[i]);
                        }
                        return false;
                    }
                }

                for (;;)
                {
                    uint c;
                    for (c = 0; c < params.m_num_comps; c++)
                    {
                        const uint comp_index = params.m_first_comp + c;

                        const float* pOutput_samples = resamplers[c]->get_line();
                        if (!pOutput_samples)
                        {
                            break;
                        }

                        const bool linear = !params.m_srgb || (comp_index == 3);
                        CRNLIB_ASSERT(dst_y < dst_height);
                        color_quad_u8* pDst = dst.get_scanline(dst_y);

                        for (uint x = 0; x < dst_width; x++)
                        {
                            if (linear)
                            {
                                int c = (int)(255.0f * pOutput_samples[x] + .5f);
                                if (c < 0)
                                {
                                    c = 0;
                                }
                                else if (c > 255)
                                {
                                    c = 255;
                                }
                                (*pDst)[comp_index] = (unsigned char)c;
                            }
                            else
                            {
                                int j = (int)(linear_to_srgb_table_size * pOutput_samples[x] + .5f);
                                if (j < 0)
                                {
                                    j = 0;
                                }
                                else if (j >= linear_to_srgb_table_size)
                                {
                                    j = linear_to_srgb_table_size - 1;
                                }
                                (*pDst)[comp_index] = linear_to_srgb[j];
                            }

                            pDst++;
                        }
                    }
                    if (c < params.m_num_comps)
                    {
                        break;
                    }

                    dst_y++;
                }
            }

            for (uint i = 0; i < params.m_num_comps; i++)
            {
                crnlib_delete(resamplers[i]);
            }

            return true;
        }